

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall defyx::JitCompilerX86::h_ISMULH_R(JitCompilerX86 *this,Instruction *instr,int i)

{
  int in_EDX;
  long in_RSI;
  JitCompilerX86 *in_RDI;
  uint8_t (*in_stack_ffffffffffffffd8) [2];
  
  in_RDI->registerUsage[*(byte *)(in_RSI + 1)] = in_EDX;
  emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
  emitByte(in_RDI,*(char *)(in_RSI + 1) + 0xc0);
  emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
  emitByte(in_RDI,*(char *)(in_RSI + 2) + 0xe8);
  emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
  emitByte(in_RDI,*(char *)(in_RSI + 1) * '\b' + 0xc2);
  return;
}

Assistant:

void JitCompilerX86::h_ISMULH_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		emit(REX_MOV_RR64);
		emitByte(0xc0 + instr.dst);
		emit(REX_MUL_R);
		emitByte(0xe8 + instr.src);
		emit(REX_MOV_R64R);
		emitByte(0xc2 + 8 * instr.dst);
	}